

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Hash.h
# Opt level: O3

void slang::hash_combine<unsigned_long,unsigned_int>(size_t *seed,unsigned_long *v,uint rest)

{
  undefined1 auVar1 [16];
  ulong uVar2;
  
  auVar1._8_8_ = 0;
  auVar1._0_8_ = *v;
  uVar2 = *seed;
  uVar2 = (uVar2 >> 2) + uVar2 * 0x40 + 0x9e3779b9 +
          (SUB168(ZEXT816(0x9e3779b97f4a7c15) * auVar1,8) ^
          SUB168(ZEXT816(0x9e3779b97f4a7c15) * auVar1,0)) ^ uVar2;
  *seed = (uVar2 >> 2) + 0x9e3779b9 +
          uVar2 * 0x40 +
          (SUB168(ZEXT416(rest) * ZEXT816(0x9e3779b97f4a7c15),8) ^
          SUB168(ZEXT416(rest) * ZEXT816(0x9e3779b97f4a7c15),0)) ^ uVar2;
  return;
}

Assistant:

inline void hash_combine(size_t& seed, const T& v, Rest... rest) {
    hash<T> hasher;
    seed ^= hasher(v) + 0x9e3779b9 + (seed << 6) + (seed >> 2);
    hash_combine(seed, rest...);
}